

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

DWORD GetModuleFileNameA(HMODULE hModule,LPSTR lpFileName,DWORD nSize)

{
  BOOL BVar1;
  DWORD DVar2;
  LPWSTR lpWideCharStr;
  LPWSTR wide_name;
  DWORD retval;
  INT name_length;
  DWORD nSize_local;
  LPSTR lpFileName_local;
  HMODULE hModule_local;
  
  wide_name._4_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  LockModuleList();
  if ((hModule == (HMODULE)0x0) || (BVar1 = LOADValidateModule((MODSTRUCT *)hModule), BVar1 != 0)) {
    lpWideCharStr = LOADGetModuleFileName((MODSTRUCT *)hModule);
    if (lpWideCharStr == (LPWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","GetModuleFileNameA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
              ,0x1d4);
      fprintf(_stderr,"Can\'t find name for valid module handle %p\n",hModule);
      SetLastError(0x54f);
    }
    else {
      DVar2 = WideCharToMultiByte(0,0,lpWideCharStr,-1,lpFileName,nSize,(LPCSTR)0x0,(LPBOOL)0x0);
      if (DVar2 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        SetLastError(0x7a);
      }
      else {
        wide_name._4_4_ = DVar2;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
    }
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(6);
  }
  UnlockModuleList();
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return wide_name._4_4_;
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetModuleFileNameA(
    IN HMODULE hModule,
    OUT LPSTR lpFileName,
    IN DWORD nSize)
{
    INT name_length;
    DWORD retval = 0;
    LPWSTR wide_name = nullptr;

    PERF_ENTRY(GetModuleFileNameA);
    ENTRY("GetModuleFileNameA (hModule=%p, lpFileName=%p, nSize=%u)\n",
          hModule, lpFileName, nSize);

    LockModuleList();
    if (hModule && !LOADValidateModule((MODSTRUCT *)hModule))
    {
        TRACE("Can't find name for invalid module handle %p\n", hModule);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }
    wide_name = LOADGetModuleFileName((MODSTRUCT *)hModule);

    if (!wide_name)
    {
        ASSERT("Can't find name for valid module handle %p\n", hModule);
        SetLastError(ERROR_INTERNAL_ERROR);
        goto done;
    }

    /* Convert module name to Ascii, place it in the supplied buffer */

    name_length = WideCharToMultiByte(CP_ACP, 0, wide_name, -1, lpFileName,
                                      nSize, nullptr, nullptr);
    if (name_length == 0)
    {
        TRACE("Buffer too small to copy module's file name.\n");
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        goto done;
    }

    TRACE("File name of module %p is %s\n", hModule, lpFileName);
    retval = name_length;
done:
    UnlockModuleList();
    LOGEXIT("GetModuleFileNameA returns DWORD %d\n", retval);
    PERF_EXIT(GetModuleFileNameA);
    return retval;
}